

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_vacuum.cpp
# Opt level: O3

void __thiscall duckdb::VacuumGlobalSinkState::~VacuumGlobalSinkState(VacuumGlobalSinkState *this)

{
  (this->super_GlobalSinkState)._vptr_GlobalSinkState =
       (_func_int **)&PTR__VacuumGlobalSinkState_019930b8;
  ::std::
  vector<duckdb::unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>_>_>
  ::~vector(&(this->column_distinct_stats).
             super_vector<duckdb::unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>_>_>
           );
  ::std::vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>::~vector
            (&(this->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
              super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>);
  operator_delete(this);
  return;
}

Assistant:

explicit VacuumGlobalSinkState(VacuumInfo &info, optional_ptr<TableCatalogEntry> table) {
		for (const auto &column_name : info.columns) {
			auto &column = table->GetColumn(column_name);
			if (DistinctStatistics::TypeIsSupported(column.GetType())) {
				column_distinct_stats.push_back(make_uniq<DistinctStatistics>());
			} else {
				column_distinct_stats.push_back(nullptr);
			}
		}
	}